

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UILighting.cpp
# Opt level: O0

void UI::LightingLoadEnvMapModal
               (shared_ptr<myvk::CommandPool> *command_pool,shared_ptr<Lighting> *lighting)

{
  bool bVar1;
  ImGuiStyle *pIVar2;
  element_type *this;
  element_type *this_00;
  bool *in_RSI;
  char *in_RDI;
  float spacing_w;
  float _x;
  char **unaff_retaddr;
  shared_ptr<myvk::CommandPool> *in_stack_00000008;
  EnvironmentMap *in_stack_00000010;
  float button_width;
  char *kFilter [2];
  ImVec2 *size_arg;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *this_01;
  undefined4 in_stack_ffffffffffffffe8;
  ImGuiWindowFlags in_stack_ffffffffffffffec;
  
  ImGui::SetNextWindowCentering();
  bVar1 = ImGui::BeginPopupModal(in_RDI,in_RSI,in_stack_ffffffffffffffec);
  if (bVar1) {
    this_01 = "*.exr";
    size_arg = (ImVec2 *)&stack0xffffffffffffffd8;
    ImGui::FileOpen(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                    "*.exr",(size_t)"*.hdr",
                    (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (int)in_stack_ffffffffffffffcc,unaff_retaddr);
    spacing_w = ImGui::GetWindowContentRegionWidth();
    pIVar2 = ImGui::GetStyle();
    _x = (spacing_w - (pIVar2->ItemSpacing).x) * 0.5;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffcc,_x,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffc4,spacing_w),size_arg);
    if (bVar1) {
      this = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18ae4f);
      myvk::CommandPool::GetQueuePtr(this);
      std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x18ae5f);
      myvk::Queue::WaitIdle((Queue *)this_01);
      this_00 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x18ae71);
      Lighting::GetEnvironmentMapPtr(this_00);
      std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x18ae81);
      EnvironmentMap::Reset(in_stack_00000010,in_stack_00000008,(char *)unaff_retaddr);
      ImGui::CloseCurrentPopup();
    }
    ImGui::SetItemDefaultFocus();
    ImGui::SameLine(in_stack_ffffffffffffffc4,spacing_w);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,_x,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffc4,spacing_w),size_arg);
    if (bVar1) {
      ImGui::CloseCurrentPopup();
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void LightingLoadEnvMapModal(const std::shared_ptr<myvk::CommandPool> &command_pool,
                             const std::shared_ptr<Lighting> &lighting) {
	ImGui::SetNextWindowCentering();
	if (ImGui::BeginPopupModal(kLightingLoadEnvMapModal, nullptr,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar |
	                               ImGuiWindowFlags_NoMove)) {
		static char name_buf[kFilenameBufSize];

		constexpr const char *kFilter[] = {"*.hdr", "*.exr"};

		ImGui::FileOpen("Env Map Filename", "...", name_buf, kFilenameBufSize, "Environment Map Filename", 2, kFilter);

		float button_width = (ImGui::GetWindowContentRegionWidth() - ImGui::GetStyle().ItemSpacing.x) * 0.5f;

		if (ImGui::Button("Load", {button_width, 0})) {
			command_pool->GetQueuePtr()->WaitIdle();
			lighting->GetEnvironmentMapPtr()->Reset(command_pool, name_buf);
			ImGui::CloseCurrentPopup();
		}
		ImGui::SetItemDefaultFocus();
		ImGui::SameLine();
		if (ImGui::Button("Cancel", {button_width, 0}))
			ImGui::CloseCurrentPopup();

		ImGui::EndPopup();
	}
}